

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O0

void __thiscall
Centaurus::CompositeATN<unsigned_char>::build_departure_set_r
          (CompositeATN<unsigned_char> *this,CATNDepartureSetFactory<unsigned_char> *deptset_factory
          ,ATNPath *path,int color,PriorityChain *priority,ATNStateStack *stack)

{
  bool bVar1;
  int iVar2;
  Identifier *id;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *this_00;
  CharClass<unsigned_char> *cc;
  ATNPath local_b0;
  NFATransition<unsigned_char> *local_90;
  NFATransition<unsigned_char> *tr;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  *__range3;
  undefined1 local_60 [8];
  ATNPath parent_path;
  CATNNode<unsigned_char> *node;
  ATNStateStack *stack_local;
  PriorityChain *priority_local;
  int color_local;
  ATNPath *path_local;
  CATNDepartureSetFactory<unsigned_char> *deptset_factory_local;
  CompositeATN<unsigned_char> *this_local;
  
  parent_path.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)get_node(this,path);
  bVar1 = CATNNode<unsigned_char>::is_stop_node
                    ((CATNNode<unsigned_char> *)
                     parent_path.
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     .
                     super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    ATNPath::parent_path((ATNPath *)local_60,path);
    iVar2 = ATNPath::depth((ATNPath *)local_60);
    if (iVar2 == 0) {
      id = ATNPath::leaf_id(path);
      build_wildcard_departure_set(this,deptset_factory,id,color,priority,stack);
    }
    else {
      build_departure_set_r(this,deptset_factory,(ATNPath *)local_60,color,priority,stack);
    }
    ATNPath::~ATNPath((ATNPath *)local_60);
  }
  else {
    this_00 = CATNNode<unsigned_char>::get_transitions
                        ((CATNNode<unsigned_char> *)
                         parent_path.
                         super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                         .
                         super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end0 = std::
             vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
             ::begin(this_00);
    tr = (NFATransition<unsigned_char> *)
         std::
         vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
         ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
                                       *)&tr), bVar1) {
      local_90 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
                 ::operator*(&__end0);
      bVar1 = NFATransition<unsigned_char>::is_epsilon(local_90);
      if (!bVar1) {
        cc = NFATransition<unsigned_char>::label(local_90);
        iVar2 = NFATransition<unsigned_char>::dest(local_90);
        ATNPath::replace_index(&local_b0,path,iVar2);
        CATNDepartureSetFactory<unsigned_char>::add(deptset_factory,cc,&local_b0,color,priority);
        ATNPath::~ATNPath(&local_b0);
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::NFATransition<unsigned_char>_*,_std::vector<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>_>
      ::operator++(&__end0);
    }
  }
  return;
}

Assistant:

void CompositeATN<TCHAR>::build_departure_set_r(CATNDepartureSetFactory<TCHAR>& deptset_factory, const ATNPath& path, int color, const PriorityChain& priority, ATNStateStack& stack) const
{
    const CATNNode<TCHAR>& node = get_node(path);

    if (node.is_stop_node())
    {
        ATNPath parent_path = path.parent_path();

        if (parent_path.depth() == 0)
        {
            build_wildcard_departure_set(deptset_factory, path.leaf_id(), color, priority, stack);
        }
        else
        {
            build_departure_set_r(deptset_factory, parent_path, color, priority, stack);
        }
    }
    else
    {
        for (const auto& tr : node.get_transitions())
        {
            if (!tr.is_epsilon())
            {
                deptset_factory.add(tr.label(), path.replace_index(tr.dest()), color, priority);
            }
        }
    }
}